

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_buffer_method_set(jit_State *J,RecordFFData *rd)

{
  uint tr_00;
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  TRef len_1;
  TRef trp_1;
  TRef len;
  TRef trp;
  TRef tr;
  TRef trbuf;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  TVar1 = recff_sbufx_write(J,TVar1);
  tr_00 = J->base[1];
  if ((tr_00 & 0x1f000000) == 0x4000000) {
    TVar2 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x4009;
    (J->fold).ins.field_0.op1 = (IRRef1)tr_00;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4513;
    (J->fold).ins.field_0.op1 = (IRRef1)tr_00;
    (J->fold).ins.field_0.op2 = 0;
    TVar3 = lj_opt_fold(J);
    lj_ir_call(J,IRCALL_lj_bufx_set,(ulong)TVar1,(ulong)TVar2,(ulong)TVar3,(ulong)tr_00);
  }
  else if ((tr_00 & 0x1f000000) == 0xa000000) {
    TVar2 = lj_crecord_topcvoid(J,tr_00,rd->argv + 1);
    TVar3 = recff_sbufx_checkint(J,rd,2);
    lj_ir_call(J,IRCALL_lj_bufx_set,(ulong)TVar1,(ulong)TVar2,(ulong)TVar3,(ulong)tr_00);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_set(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr = J->base[1];
  if (tref_isstr(tr)) {
    TRef trp = emitir(IRT(IR_STRREF, IRT_PGC), tr, lj_ir_kint(J, 0));
    TRef len = emitir(IRTI(IR_FLOAD), tr, IRFL_STR_LEN);
    lj_ir_call(J, IRCALL_lj_bufx_set, trbuf, trp, len, tr);
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    TRef trp = lj_crecord_topcvoid(J, tr, &rd->argv[1]);
    TRef len = recff_sbufx_checkint(J, rd, 2);
    lj_ir_call(J, IRCALL_lj_bufx_set, trbuf, trp, len, tr);
#endif
  }  /* else: Interpreter will throw. */
}